

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

void listener_stats_init(nni_listener *l)

{
  uint32_t id;
  nni_listener *l_local;
  
  nni_stat_init(&l->st_root,&listener_stats_init::root_info);
  listener_stat_init(l,&l->st_id,&listener_stats_init::id_info);
  listener_stat_init(l,&l->st_sock,&listener_stats_init::sock_info);
  listener_stat_init(l,&l->st_pipes,&listener_stats_init::pipes_info);
  listener_stat_init(l,&l->st_accept,&listener_stats_init::accept_info);
  listener_stat_init(l,&l->st_disconnect,&listener_stats_init::disconnect_info);
  listener_stat_init(l,&l->st_canceled,&listener_stats_init::canceled_info);
  listener_stat_init(l,&l->st_other,&listener_stats_init::other_info);
  listener_stat_init(l,&l->st_timeout,&listener_stats_init::timeout_info);
  listener_stat_init(l,&l->st_proto,&listener_stats_init::proto_info);
  listener_stat_init(l,&l->st_auth,&listener_stats_init::auth_info);
  listener_stat_init(l,&l->st_oom,&listener_stats_init::oom_info);
  listener_stat_init(l,&l->st_reject,&listener_stats_init::reject_info);
  nni_stat_set_id(&l->st_root,l->l_id);
  nni_stat_set_id(&l->st_id,l->l_id);
  id = nni_sock_id(l->l_sock);
  nni_stat_set_id(&l->st_sock,id);
  return;
}

Assistant:

static void
listener_stats_init(nni_listener *l)
{
#ifdef NNG_ENABLE_STATS
	static const nni_stat_info root_info = {
		.si_name = "listener",
		.si_desc = "listener statistics",
		.si_type = NNG_STAT_SCOPE,
	};
	static const nni_stat_info id_info = {
		.si_name = "id",
		.si_desc = "listener id",
		.si_type = NNG_STAT_ID,
	};
	static const nni_stat_info sock_info = {
		.si_name = "socket",
		.si_desc = "socket id",
		.si_type = NNG_STAT_ID,
	};
	static const nni_stat_info pipes_info = {
		.si_name   = "pipes",
		.si_desc   = "open pipes",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info accept_info = {
		.si_name   = "accept",
		.si_desc   = "connections accepted",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info disconnect_info = {
		.si_name   = "disconnect",
		.si_desc   = "remote disconnects",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info canceled_info = {
		.si_name   = "canceled",
		.si_desc   = "canceled connections",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info other_info = {
		.si_name   = "other",
		.si_desc   = "other errors",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info timeout_info = {
		.si_name   = "timeout",
		.si_desc   = "timeout errors",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info proto_info = {
		.si_name   = "proto",
		.si_desc   = "protocol errors",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info auth_info = {
		.si_name   = "auth",
		.si_desc   = "auth errors",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info oom_info = {
		.si_name   = "oom",
		.si_desc   = "allocation failures",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};
	static const nni_stat_info reject_info = {
		.si_name   = "reject",
		.si_desc   = "rejected pipes",
		.si_type   = NNG_STAT_COUNTER,
		.si_atomic = true,
	};

	nni_stat_init(&l->st_root, &root_info);

	listener_stat_init(l, &l->st_id, &id_info);
	listener_stat_init(l, &l->st_sock, &sock_info);
	listener_stat_init(l, &l->st_pipes, &pipes_info);
	listener_stat_init(l, &l->st_accept, &accept_info);
	listener_stat_init(l, &l->st_disconnect, &disconnect_info);
	listener_stat_init(l, &l->st_canceled, &canceled_info);
	listener_stat_init(l, &l->st_other, &other_info);
	listener_stat_init(l, &l->st_timeout, &timeout_info);
	listener_stat_init(l, &l->st_proto, &proto_info);
	listener_stat_init(l, &l->st_auth, &auth_info);
	listener_stat_init(l, &l->st_oom, &oom_info);
	listener_stat_init(l, &l->st_reject, &reject_info);

	nni_stat_set_id(&l->st_root, (int) l->l_id);
	nni_stat_set_id(&l->st_id, (int) l->l_id);
	nni_stat_set_id(&l->st_sock, (int) nni_sock_id(l->l_sock));
#else
	NNI_ARG_UNUSED(l);
#endif // NNG_ENABLE_STATS
}